

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O2

void __thiscall mocker::ast::ForStmt::~ForStmt(ForStmt *this)

{
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ForStmt_001f3578;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->body).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->update).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->condition).
              super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->init).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_Statement).super_ASTNode.
              super_enable_shared_from_this<mocker::ast::ASTNode>._M_weak_this.
              super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ForStmt(std::shared_ptr<Expression> init,
          std::shared_ptr<Expression> condition,
          std::shared_ptr<Expression> update, std::shared_ptr<Statement> body)
      : init(std::move(init)), condition(std::move(condition)),
        update(std::move(update)), body(std::move(body)) {}